

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O1

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  block blockR;
  block block_tmp;
  ulong auStack_bb8 [16];
  ulong auStack_b38 [16];
  ulong auStack_ab8 [16];
  ulong auStack_a38 [16];
  ulong auStack_9b8 [16];
  ulong auStack_938 [16];
  ulong auStack_8b8 [16];
  block *local_838;
  block local_830;
  block local_430;
  
  auStack_8b8[9] = 0x124544;
  rxa2_copy_block(&local_830,ref_block);
  auStack_8b8[9] = 0x12454f;
  rxa2_xor_block(&local_830,prev_block);
  auStack_8b8[9] = 0x12455f;
  rxa2_copy_block(&local_430,&local_830);
  if (with_xor != 0) {
    auStack_8b8[9] = 0x124573;
    rxa2_xor_block(&local_430,next_block);
  }
  lVar16 = 0x78;
  do {
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x30);
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x10);
    uVar20 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar1;
    uVar11 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x70) ^ uVar20;
    uVar7 = uVar11 >> 0x20;
    uVar12 = uVar11 << 0x20 | uVar7;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x50);
    uVar8 = (lVar1 * 2 & 0x1fffffffeU) * uVar7 + uVar12 + lVar1;
    uVar7 = (uVar10 ^ uVar8) >> 0x18;
    uVar11 = (uVar10 ^ uVar8) << 0x28 | uVar7;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x18);
    uVar21 = (uVar20 * 2 & 0x1fffffffe) * (uVar7 & 0xffffffff) + uVar11 + uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x10) = uVar21;
    uVar12 = uVar12 ^ uVar21;
    uVar10 = uVar12 >> 0x10;
    uVar13 = uVar12 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x70) = uVar13;
    uVar9 = (uVar8 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar13 + uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x50) = uVar9;
    uVar11 = uVar11 ^ uVar9;
    uVar7 = uVar11 << 1;
    uVar12 = (ulong)((long)uVar11 < 0);
    uVar5 = uVar7 | uVar12;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x30) = uVar5;
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x38);
    uVar18 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    uVar8 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x78) ^ uVar18;
    uVar11 = uVar8 >> 0x20;
    uVar14 = uVar8 << 0x20 | uVar11;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x58);
    uVar20 = (lVar1 * 2 & 0x1fffffffeU) * uVar11 + uVar14 + lVar1;
    uVar11 = (uVar10 ^ uVar20) >> 0x18;
    uVar8 = (uVar10 ^ uVar20) << 0x28 | uVar11;
    uVar19 = (uVar18 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar18 + uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x18) = uVar19;
    uVar14 = uVar14 ^ uVar19;
    uVar10 = uVar14 >> 0x10;
    uVar15 = uVar14 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x78) = uVar15;
    uVar6 = (uVar20 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar15 + uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x58) = uVar6;
    uVar8 = uVar8 ^ uVar6;
    uVar11 = uVar8 << 1;
    uVar20 = (ulong)((long)uVar8 < 0);
    uVar4 = uVar11 | uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x38) = uVar4;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x20);
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x40);
    uVar24 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x20) = uVar24;
    uVar14 = *(ulong *)((long)local_830.v + lVar16 + -8) ^ uVar24;
    uVar8 = uVar14 >> 0x20;
    uVar18 = uVar14 << 0x20 | uVar8;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar18;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x60);
    uVar14 = (lVar1 * 2 & 0x1fffffffeU) * uVar8 + uVar18 + lVar1;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x60) = uVar14;
    uVar8 = (uVar10 ^ uVar14) >> 0x18;
    uVar22 = (uVar10 ^ uVar14) << 0x28 | uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x40) = uVar22;
    uVar25 = (uVar24 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar24 + uVar22;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x20) = uVar25;
    uVar10 = (uVar18 ^ uVar25) >> 0x10;
    uVar17 = (uVar18 ^ uVar25) << 0x30 | uVar10;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar17;
    uVar24 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar17 + uVar14;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x60) = uVar24;
    uVar8 = (uVar22 ^ uVar24) << 1;
    uVar14 = (ulong)((long)(uVar22 ^ uVar24) < 0);
    uVar23 = uVar8 | uVar14;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x40) = uVar23;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x28);
    uVar10 = *(ulong *)((long)auStack_8b8 + lVar16 + 0x48);
    uVar26 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar1;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x28) = uVar26;
    uVar22 = *(ulong *)((long)local_830.v + lVar16) ^ uVar26;
    uVar18 = uVar22 >> 0x20;
    uVar2 = uVar22 << 0x20 | uVar18;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    lVar1 = *(long *)((long)auStack_8b8 + lVar16 + 0x68);
    uVar22 = (lVar1 * 2 & 0x1fffffffeU) * uVar18 + uVar2 + lVar1;
    uVar18 = (uVar10 ^ uVar22) >> 0x18;
    uVar3 = (uVar10 ^ uVar22) << 0x28 | uVar18;
    uVar26 = (uVar26 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar3 + uVar26;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x68) = uVar22;
    uVar10 = (uVar2 ^ uVar26) >> 0x10;
    uVar18 = (uVar2 ^ uVar26) << 0x30 | uVar10;
    uVar21 = (uVar21 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff | uVar20) + uVar21 + uVar4;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x48) = uVar3;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x28) = uVar26;
    *(ulong *)((long)local_830.v + lVar16) = uVar18;
    uVar11 = (uVar18 ^ uVar21) >> 0x20;
    uVar2 = (uVar18 ^ uVar21) << 0x20 | uVar11;
    uVar22 = (uVar22 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar18 + uVar22;
    uVar18 = (uVar24 * 2 & 0x1fffffffe) * uVar11 + uVar2 + uVar24;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x68) = uVar22;
    uVar10 = (uVar3 ^ uVar22) << 1;
    uVar11 = (ulong)((long)(uVar3 ^ uVar22) < 0);
    uVar24 = uVar10 | uVar11;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x48) = uVar24;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x10) = uVar21;
    uVar20 = (uVar4 ^ uVar18) >> 0x18;
    uVar3 = (uVar4 ^ uVar18) << 0x28 | uVar20;
    uVar4 = (uVar21 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar21 + uVar3;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x60) = uVar18;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x10) = uVar4;
    uVar4 = uVar4 ^ uVar2;
    uVar20 = uVar4 >> 0x10;
    uVar2 = uVar4 << 0x30 | uVar20;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    uVar20 = (uVar18 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar2 + uVar18;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x60) = uVar20;
    uVar20 = uVar20 ^ uVar3;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x38) = uVar20 << 1 | (ulong)((long)uVar20 < 0);
    uVar18 = (uVar19 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff | uVar14) + uVar19 + uVar23;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x18) = uVar18;
    uVar8 = (uVar13 ^ uVar18) >> 0x20;
    uVar14 = (uVar13 ^ uVar18) << 0x20 | uVar8;
    uVar20 = (uVar22 * 2 & 0x1fffffffe) * uVar8 + uVar22 + uVar14;
    uVar8 = (uVar23 ^ uVar20) >> 0x18;
    uVar22 = (uVar23 ^ uVar20) << 0x28 | uVar8;
    uVar18 = (uVar18 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar18 + uVar22;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x70) = uVar14;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x68) = uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x18) = uVar18;
    uVar18 = uVar18 ^ uVar14;
    uVar8 = uVar18 >> 0x10;
    uVar14 = uVar18 << 0x30 | uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x70) = uVar14;
    uVar8 = (uVar20 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar14 + uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x68) = uVar8;
    uVar8 = uVar8 ^ uVar22;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x40) = uVar8 << 1 | (ulong)((long)uVar8 < 0);
    uVar14 = (uVar25 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar11) + uVar24 + uVar25;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x20) = uVar14;
    uVar10 = (uVar15 ^ uVar14) >> 0x20;
    uVar20 = (uVar15 ^ uVar14) << 0x20 | uVar10;
    uVar8 = (uVar9 * 2 & 0x1fffffffe) * uVar10 + uVar20 + uVar9;
    uVar10 = (uVar24 ^ uVar8) >> 0x18;
    uVar11 = (uVar24 ^ uVar8) << 0x28 | uVar10;
    uVar14 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar11 + uVar14;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x78) = uVar20;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x50) = uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x20) = uVar14;
    uVar14 = uVar14 ^ uVar20;
    uVar10 = uVar14 >> 0x10;
    uVar20 = uVar14 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x78) = uVar20;
    uVar10 = (uVar8 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar20 + uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x50) = uVar10;
    uVar10 = uVar10 ^ uVar11;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x48) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    uVar12 = (uVar26 * 2 & 0x1fffffffe) * (uVar7 & 0xffffffff | uVar12) + uVar26 + uVar5;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x28) = uVar12;
    uVar10 = (uVar17 ^ uVar12) >> 0x20;
    uVar8 = (uVar17 ^ uVar12) << 0x20 | uVar10;
    uVar7 = (uVar6 * 2 & 0x1fffffffe) * uVar10 + uVar8 + uVar6;
    uVar10 = (uVar5 ^ uVar7) >> 0x18;
    uVar11 = (uVar5 ^ uVar7) << 0x28 | uVar10;
    uVar12 = (uVar12 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar11 + uVar12;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x58) = uVar7;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x28) = uVar12;
    uVar12 = uVar12 ^ uVar8;
    uVar10 = uVar12 >> 0x10;
    uVar8 = uVar12 << 0x30 | uVar10;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar8;
    uVar10 = (uVar7 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar8 + uVar7;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x58) = uVar10;
    uVar10 = uVar10 ^ uVar11;
    *(ulong *)((long)auStack_8b8 + lVar16 + 0x30) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    lVar16 = lVar16 + 0x80;
  } while (lVar16 != 0x478);
  lVar16 = 0x388;
  do {
    uVar10 = *(ulong *)((long)auStack_ab8 + lVar16);
    uVar20 = (*(long *)((long)auStack_bb8 + lVar16) * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) +
             uVar10 + *(long *)((long)auStack_bb8 + lVar16);
    uVar11 = *(ulong *)((long)auStack_8b8 + lVar16) ^ uVar20;
    uVar7 = uVar11 >> 0x20;
    uVar12 = uVar11 << 0x20 | uVar7;
    uVar8 = (*(long *)((long)auStack_9b8 + lVar16) * 2 & 0x1fffffffeU) * uVar7 +
            uVar12 + *(long *)((long)auStack_9b8 + lVar16);
    uVar7 = (uVar10 ^ uVar8) >> 0x18;
    uVar11 = (uVar10 ^ uVar8) << 0x28 | uVar7;
    lVar1 = *(long *)((long)auStack_bb8 + lVar16 + 8);
    uVar13 = (uVar20 * 2 & 0x1fffffffe) * (uVar7 & 0xffffffff) + uVar11 + uVar20;
    *(ulong *)((long)auStack_bb8 + lVar16) = uVar13;
    uVar12 = uVar12 ^ uVar13;
    uVar10 = uVar12 >> 0x10;
    auStack_8b8[0xc] = uVar12 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16) = auStack_8b8[0xc];
    uVar6 = (uVar8 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xc] + uVar8;
    *(ulong *)((long)auStack_9b8 + lVar16) = uVar6;
    uVar11 = uVar11 ^ uVar6;
    uVar7 = uVar11 << 1;
    uVar12 = (ulong)((long)uVar11 < 0);
    auStack_8b8[0xf] = uVar7 | uVar12;
    *(ulong *)((long)auStack_ab8 + lVar16) = auStack_8b8[0xf];
    uVar10 = *(ulong *)((long)auStack_ab8 + lVar16 + 8);
    uVar18 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + uVar10 + lVar1;
    uVar8 = *(ulong *)((long)auStack_8b8 + lVar16 + 8) ^ uVar18;
    uVar11 = uVar8 >> 0x20;
    uVar14 = uVar8 << 0x20 | uVar11;
    lVar1 = *(long *)((long)auStack_9b8 + lVar16 + 8);
    uVar20 = (lVar1 * 2 & 0x1fffffffeU) * uVar11 + uVar14 + lVar1;
    uVar11 = (uVar10 ^ uVar20) >> 0x18;
    uVar8 = (uVar10 ^ uVar20) << 0x28 | uVar11;
    uVar9 = (uVar18 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar8 + uVar18;
    *(ulong *)((long)auStack_bb8 + lVar16 + 8) = uVar9;
    uVar14 = uVar14 ^ uVar9;
    uVar10 = uVar14 >> 0x10;
    auStack_8b8[0xe] = uVar14 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 8) = auStack_8b8[0xe];
    uVar5 = (uVar20 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xe] + uVar20;
    *(ulong *)((long)auStack_9b8 + lVar16 + 8) = uVar5;
    uVar8 = uVar8 ^ uVar5;
    uVar11 = uVar8 << 1;
    uVar20 = (ulong)((long)uVar8 < 0);
    uVar3 = uVar11 | uVar20;
    *(ulong *)((long)auStack_ab8 + lVar16 + 8) = uVar3;
    uVar10 = *(ulong *)((long)auStack_a38 + lVar16);
    uVar24 = (*(long *)((long)auStack_b38 + lVar16) * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) +
             *(long *)((long)auStack_b38 + lVar16) + uVar10;
    *(ulong *)((long)auStack_b38 + lVar16) = uVar24;
    uVar14 = *(ulong *)((long)local_830.v + lVar16 + -8) ^ uVar24;
    uVar8 = uVar14 >> 0x20;
    uVar18 = uVar14 << 0x20 | uVar8;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar18;
    uVar14 = (*(long *)((long)auStack_938 + lVar16) * 2 & 0x1fffffffeU) * uVar8 +
             uVar18 + *(long *)((long)auStack_938 + lVar16);
    *(ulong *)((long)auStack_938 + lVar16) = uVar14;
    uVar8 = (uVar10 ^ uVar14) >> 0x18;
    uVar22 = (uVar10 ^ uVar14) << 0x28 | uVar8;
    *(ulong *)((long)auStack_a38 + lVar16) = uVar22;
    uVar17 = (uVar24 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar24 + uVar22;
    *(ulong *)((long)auStack_b38 + lVar16) = uVar17;
    uVar10 = (uVar18 ^ uVar17) >> 0x10;
    auStack_8b8[0xd] = (uVar18 ^ uVar17) << 0x30 | uVar10;
    *(ulong *)((long)local_830.v + lVar16 + -8) = auStack_8b8[0xd];
    uVar24 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xd] + uVar14;
    *(ulong *)((long)auStack_938 + lVar16) = uVar24;
    uVar8 = (uVar22 ^ uVar24) << 1;
    uVar14 = (ulong)((long)(uVar22 ^ uVar24) < 0);
    uVar15 = uVar8 | uVar14;
    *(ulong *)((long)auStack_a38 + lVar16) = uVar15;
    lVar1 = *(long *)((long)auStack_b38 + lVar16 + 8);
    uVar10 = *(ulong *)((long)auStack_a38 + lVar16 + 8);
    uVar19 = (lVar1 * 2 & 0x1fffffffeU) * (uVar10 & 0xffffffff) + lVar1 + uVar10;
    *(ulong *)((long)auStack_b38 + lVar16 + 8) = uVar19;
    uVar22 = *(ulong *)((long)local_830.v + lVar16) ^ uVar19;
    uVar18 = uVar22 >> 0x20;
    uVar2 = uVar22 << 0x20 | uVar18;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    lVar1 = *(long *)((long)auStack_938 + lVar16 + 8);
    uVar22 = (lVar1 * 2 & 0x1fffffffeU) * uVar18 + uVar2 + lVar1;
    uVar18 = (uVar10 ^ uVar22) >> 0x18;
    uVar4 = (uVar10 ^ uVar22) << 0x28 | uVar18;
    uVar19 = (uVar19 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar19 + uVar4;
    *(ulong *)((long)auStack_938 + lVar16 + 8) = uVar22;
    uVar10 = (uVar2 ^ uVar19) >> 0x10;
    uVar18 = (uVar2 ^ uVar19) << 0x30 | uVar10;
    auStack_8b8[0xb] = uVar18 + uVar22;
    uVar13 = (uVar13 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff | uVar20) + uVar3 + uVar13;
    *(ulong *)((long)auStack_a38 + lVar16 + 8) = uVar4;
    *(ulong *)((long)auStack_b38 + lVar16 + 8) = uVar19;
    *(ulong *)((long)local_830.v + lVar16) = uVar18;
    uVar11 = (uVar18 ^ uVar13) >> 0x20;
    uVar2 = (uVar18 ^ uVar13) << 0x20 | uVar11;
    uVar22 = (uVar22 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + auStack_8b8[0xb];
    uVar18 = (uVar24 * 2 & 0x1fffffffe) * uVar11 + uVar2 + uVar24;
    *(ulong *)((long)auStack_938 + lVar16 + 8) = uVar22;
    uVar10 = (uVar4 ^ uVar22) << 1;
    uVar11 = (ulong)((long)(uVar4 ^ uVar22) < 0);
    uVar4 = uVar10 | uVar11;
    *(ulong *)((long)auStack_a38 + lVar16 + 8) = uVar4;
    *(ulong *)((long)auStack_bb8 + lVar16) = uVar13;
    uVar20 = (uVar3 ^ uVar18) >> 0x18;
    uVar24 = (uVar3 ^ uVar18) << 0x28 | uVar20;
    uVar3 = (uVar13 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar24 + uVar13;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    *(ulong *)((long)auStack_938 + lVar16) = uVar18;
    *(ulong *)((long)auStack_bb8 + lVar16) = uVar3;
    uVar3 = uVar3 ^ uVar2;
    uVar20 = uVar3 >> 0x10;
    uVar2 = uVar3 << 0x30 | uVar20;
    *(ulong *)((long)local_830.v + lVar16) = uVar2;
    uVar20 = (uVar18 * 2 & 0x1fffffffe) * (uVar20 & 0xffffffff) + uVar2 + uVar18;
    *(ulong *)((long)auStack_938 + lVar16) = uVar20;
    uVar20 = uVar20 ^ uVar24;
    *(ulong *)((long)auStack_ab8 + lVar16 + 8) = uVar20 << 1 | (ulong)((long)uVar20 < 0);
    uVar18 = (uVar9 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff | uVar14) + uVar9 + uVar15;
    *(ulong *)((long)auStack_bb8 + lVar16 + 8) = uVar18;
    uVar8 = (auStack_8b8[0xc] ^ uVar18) >> 0x20;
    uVar14 = (auStack_8b8[0xc] ^ uVar18) << 0x20 | uVar8;
    uVar20 = (uVar22 * 2 & 0x1fffffffe) * uVar8 + uVar22 + uVar14;
    uVar8 = (uVar15 ^ uVar20) >> 0x18;
    uVar24 = (uVar15 ^ uVar20) << 0x28 | uVar8;
    uVar18 = (uVar18 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar18 + uVar24;
    *(ulong *)((long)auStack_8b8 + lVar16) = uVar14;
    *(ulong *)((long)auStack_938 + lVar16 + 8) = uVar20;
    *(ulong *)((long)auStack_bb8 + lVar16 + 8) = uVar18;
    uVar18 = uVar18 ^ uVar14;
    uVar8 = uVar18 >> 0x10;
    uVar14 = uVar18 << 0x30 | uVar8;
    *(ulong *)((long)auStack_8b8 + lVar16) = uVar14;
    uVar8 = (uVar20 * 2 & 0x1fffffffe) * (uVar8 & 0xffffffff) + uVar14 + uVar20;
    *(ulong *)((long)auStack_938 + lVar16 + 8) = uVar8;
    uVar8 = uVar8 ^ uVar24;
    *(ulong *)((long)auStack_a38 + lVar16) = uVar8 << 1 | (ulong)((long)uVar8 < 0);
    uVar14 = (uVar17 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff | uVar11) + uVar17 + uVar4;
    *(ulong *)((long)auStack_b38 + lVar16) = uVar14;
    uVar10 = (auStack_8b8[0xe] ^ uVar14) >> 0x20;
    uVar20 = (auStack_8b8[0xe] ^ uVar14) << 0x20 | uVar10;
    uVar8 = (uVar6 * 2 & 0x1fffffffe) * uVar10 + uVar20 + uVar6;
    uVar10 = (uVar4 ^ uVar8) >> 0x18;
    uVar11 = (uVar4 ^ uVar8) << 0x28 | uVar10;
    uVar14 = (uVar14 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar14 + uVar11;
    *(ulong *)((long)auStack_8b8 + lVar16 + 8) = uVar20;
    *(ulong *)((long)auStack_9b8 + lVar16) = uVar8;
    *(ulong *)((long)auStack_b38 + lVar16) = uVar14;
    uVar14 = uVar14 ^ uVar20;
    uVar10 = uVar14 >> 0x10;
    uVar20 = uVar14 << 0x30 | uVar10;
    *(ulong *)((long)auStack_8b8 + lVar16 + 8) = uVar20;
    uVar10 = (uVar8 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar20 + uVar8;
    *(ulong *)((long)auStack_9b8 + lVar16) = uVar10;
    uVar10 = uVar10 ^ uVar11;
    *(ulong *)((long)auStack_a38 + lVar16 + 8) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    uVar12 = (uVar19 * 2 & 0x1fffffffe) * (uVar7 & 0xffffffff | uVar12) + uVar19 + auStack_8b8[0xf];
    *(ulong *)((long)auStack_b38 + lVar16 + 8) = uVar12;
    uVar10 = (auStack_8b8[0xd] ^ uVar12) >> 0x20;
    uVar8 = (auStack_8b8[0xd] ^ uVar12) << 0x20 | uVar10;
    uVar7 = (uVar5 * 2 & 0x1fffffffe) * uVar10 + uVar8 + uVar5;
    uVar10 = (auStack_8b8[0xf] ^ uVar7) >> 0x18;
    uVar11 = (auStack_8b8[0xf] ^ uVar7) << 0x28 | uVar10;
    uVar12 = (uVar12 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar11 + uVar12;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar8;
    *(ulong *)((long)auStack_9b8 + lVar16 + 8) = uVar7;
    *(ulong *)((long)auStack_b38 + lVar16 + 8) = uVar12;
    uVar12 = uVar12 ^ uVar8;
    uVar10 = uVar12 >> 0x10;
    uVar8 = uVar12 << 0x30 | uVar10;
    *(ulong *)((long)local_830.v + lVar16 + -8) = uVar8;
    uVar10 = (uVar7 * 2 & 0x1fffffffe) * (uVar10 & 0xffffffff) + uVar8 + uVar7;
    *(ulong *)((long)auStack_9b8 + lVar16 + 8) = uVar10;
    uVar10 = uVar10 ^ uVar11;
    *(ulong *)((long)auStack_ab8 + lVar16) = uVar10 << 1 | (ulong)((long)uVar10 < 0);
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x408);
  auStack_8b8[9] = 0x1250d5;
  local_838 = next_block;
  rxa2_copy_block(next_block,&local_430);
  auStack_8b8[9] = 0x1250e2;
  rxa2_xor_block(next_block,&local_830);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
	block *next_block, int with_xor) {
	block blockR, block_tmp;
	unsigned i;

	rxa2_copy_block(&blockR, ref_block);
	rxa2_xor_block(&blockR, prev_block);
	rxa2_copy_block(&block_tmp, &blockR);
	/* Now blockR = ref_block + prev_block and block_tmp = ref_block + prev_block */
	if (with_xor) {
		/* Saving the next block contents for XOR over: */
		rxa2_xor_block(&block_tmp, next_block);
		/* Now blockR = ref_block + prev_block and
		   block_tmp = ref_block + prev_block + next_block */
	}

	/* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
	   (16,17,..31)... finally (112,113,...127) */
	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[16 * i], blockR.v[16 * i + 1], blockR.v[16 * i + 2],
			blockR.v[16 * i + 3], blockR.v[16 * i + 4], blockR.v[16 * i + 5],
			blockR.v[16 * i + 6], blockR.v[16 * i + 7], blockR.v[16 * i + 8],
			blockR.v[16 * i + 9], blockR.v[16 * i + 10], blockR.v[16 * i + 11],
			blockR.v[16 * i + 12], blockR.v[16 * i + 13], blockR.v[16 * i + 14],
			blockR.v[16 * i + 15]);
	}

	/* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
	   (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
	for (i = 0; i < 8; i++) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[2 * i], blockR.v[2 * i + 1], blockR.v[2 * i + 16],
			blockR.v[2 * i + 17], blockR.v[2 * i + 32], blockR.v[2 * i + 33],
			blockR.v[2 * i + 48], blockR.v[2 * i + 49], blockR.v[2 * i + 64],
			blockR.v[2 * i + 65], blockR.v[2 * i + 80], blockR.v[2 * i + 81],
			blockR.v[2 * i + 96], blockR.v[2 * i + 97], blockR.v[2 * i + 112],
			blockR.v[2 * i + 113]);
	}

	rxa2_copy_block(next_block, &block_tmp);
	rxa2_xor_block(next_block, &blockR);
}